

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

size_t __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
ImplicitProducer::
dequeue_bulk<__gnu_cxx::__normal_iterator<duckdb::BufferEvictionNode*,std::vector<duckdb::BufferEvictionNode,std::allocator<duckdb::BufferEvictionNode>>>>
          (ImplicitProducer *this,
          __normal_iterator<duckdb::BufferEvictionNode_*,_std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>_>
          *itemFirst,size_t max)

{
  ImplicitProducer *pIVar1;
  atomic<unsigned_long> *paVar2;
  __int_type _Var3;
  BlockIndexEntry *pBVar4;
  Block *node;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  index_t index;
  ulong uVar9;
  ulong uVar10;
  BlockIndexHeader *localBlockIndex;
  BlockIndexHeader *local_38;
  
  uVar5 = (*(long *)(this + 0x38) - *(long *)(this + 0x30)) + *(long *)(this + 0x20);
  if (0 < (long)uVar5) {
    if (uVar5 < max) {
      max = uVar5;
    }
    LOCK();
    pIVar1 = this + 0x30;
    lVar8 = *(long *)pIVar1;
    *(size_t *)pIVar1 = *(long *)pIVar1 + max;
    UNLOCK();
    uVar5 = (*(long *)(this + 0x38) - lVar8) + *(long *)(this + 0x20);
    if (0 < (long)uVar5) {
      uVar7 = uVar5;
      if (max < uVar5) {
        uVar7 = max;
      }
      if (uVar5 < max) {
        LOCK();
        *(size_t *)(this + 0x38) = *(long *)(this + 0x38) + (max - uVar7);
        UNLOCK();
      }
      LOCK();
      pIVar1 = this + 0x28;
      index = *(index_t *)pIVar1;
      *(index_t *)pIVar1 = *(index_t *)pIVar1 + uVar7;
      UNLOCK();
      sVar6 = ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
              ::ImplicitProducer::get_block_index_index_for_index
                        ((ImplicitProducer *)this,index,&local_38);
      uVar5 = index + uVar7;
      do {
        uVar9 = (index & 0xffffffffffffffe0) + 0x20;
        if (0x8000000000000000 < uVar5 - uVar9) {
          uVar9 = uVar5;
        }
        pBVar4 = local_38->index[sVar6];
        node = (pBVar4->value)._M_b._M_p;
        for (uVar10 = index; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          lVar8 = (ulong)((uint)uVar10 & 0x1f) * 0x18;
          duckdb::BufferEvictionNode::operator=
                    (itemFirst->_M_current,(BufferEvictionNode *)(node->elements + lVar8));
          itemFirst->_M_current = itemFirst->_M_current + 1;
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(node->elements + lVar8 + 8));
        }
        LOCK();
        paVar2 = &node->elementsCompletelyDequeued;
        _Var3 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i + (uVar9 - index);
        UNLOCK();
        if (_Var3 + (uVar9 - index) == 0x20) {
          (pBVar4->value)._M_b._M_p = (__pointer_type)0x0;
          ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
          ::
          FreeList<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
          ::add((FreeList<duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
                 *)(*(long *)(this + 0x50) + 0x28),node);
        }
        sVar6 = sVar6 + 1 & local_38->capacity - 1;
        index = uVar9;
      } while (uVar9 != uVar5);
      return uVar7;
    }
    LOCK();
    *(size_t *)(this + 0x38) = *(long *)(this + 0x38) + max;
    UNLOCK();
  }
  return 0;
}

Assistant:

size_t dequeue_bulk(It& itemFirst, size_t max)
		{
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto overcommit = this->dequeueOvercommit.load(std::memory_order_relaxed);
			auto desiredCount = static_cast<size_t>(tail - (this->dequeueOptimisticCount.load(std::memory_order_relaxed) - overcommit));
			if (details::circular_less_than<size_t>(0, desiredCount)) {
				desiredCount = desiredCount < max ? desiredCount : max;
				std::atomic_thread_fence(std::memory_order_acquire);
				
				auto myDequeueCount = this->dequeueOptimisticCount.fetch_add(desiredCount, std::memory_order_relaxed);
				
				tail = this->tailIndex.load(std::memory_order_acquire);
				auto actualCount = static_cast<size_t>(tail - (myDequeueCount - overcommit));
				if (details::circular_less_than<size_t>(0, actualCount)) {
					actualCount = desiredCount < actualCount ? desiredCount : actualCount;
					if (actualCount < desiredCount) {
						this->dequeueOvercommit.fetch_add(desiredCount - actualCount, std::memory_order_release);
					}
					
					// Get the first index. Note that since there's guaranteed to be at least actualCount elements, this
					// will never exceed tail.
					auto firstIndex = this->headIndex.fetch_add(actualCount, std::memory_order_acq_rel);
					
					// Iterate the blocks and dequeue
					auto index = firstIndex;
					BlockIndexHeader* localBlockIndex;
					auto indexIndex = get_block_index_index_for_index(index, localBlockIndex);
					do {
						auto blockStartIndex = index;
						auto endIndex = (index & ~static_cast<index_t>(BLOCK_SIZE - 1)) + static_cast<index_t>(BLOCK_SIZE);
						endIndex = details::circular_less_than<index_t>(firstIndex + static_cast<index_t>(actualCount), endIndex) ? firstIndex + static_cast<index_t>(actualCount) : endIndex;
						
						auto entry = localBlockIndex->index[indexIndex];
						auto block = entry->value.load(std::memory_order_relaxed);
						if (MOODYCAMEL_NOEXCEPT_ASSIGN(T, T&&, details::deref_noexcept(itemFirst) = std::move((*(*block)[index])))) {
							while (index != endIndex) {
								auto& el = *((*block)[index]);
								*itemFirst++ = std::move(el);
								el.~T();
								++index;
							}
						}
						else {
							MOODYCAMEL_TRY {
								while (index != endIndex) {
									auto& el = *((*block)[index]);
									*itemFirst = std::move(el);
									++itemFirst;
									el.~T();
									++index;
								}
							}
							MOODYCAMEL_CATCH (...) {
								do {
									entry = localBlockIndex->index[indexIndex];
									block = entry->value.load(std::memory_order_relaxed);
									while (index != endIndex) {
										(*block)[index++]->~T();
									}
									
									if (block->ConcurrentQueue::Block::template set_many_empty<implicit_context>(blockStartIndex, static_cast<size_t>(endIndex - blockStartIndex))) {
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
										debug::DebugLock lock(mutex);
#endif
										entry->value.store(nullptr, std::memory_order_relaxed);
										this->parent->add_block_to_free_list(block);
									}
									indexIndex = (indexIndex + 1) & (localBlockIndex->capacity - 1);
									
									blockStartIndex = index;
									endIndex = (index & ~static_cast<index_t>(BLOCK_SIZE - 1)) + static_cast<index_t>(BLOCK_SIZE);
									endIndex = details::circular_less_than<index_t>(firstIndex + static_cast<index_t>(actualCount), endIndex) ? firstIndex + static_cast<index_t>(actualCount) : endIndex;
								} while (index != firstIndex + actualCount);
								
								MOODYCAMEL_RETHROW;
							}
						}
						if (block->ConcurrentQueue::Block::template set_many_empty<implicit_context>(blockStartIndex, static_cast<size_t>(endIndex - blockStartIndex))) {
							{
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
								debug::DebugLock lock(mutex);
#endif
								// Note that the set_many_empty above did a release, meaning that anybody who acquires the block
								// we're about to free can use it safely since our writes (and reads!) will have happened-before then.
								entry->value.store(nullptr, std::memory_order_relaxed);
							}
							this->parent->add_block_to_free_list(block);		// releases the above store
						}
						indexIndex = (indexIndex + 1) & (localBlockIndex->capacity - 1);
					} while (index != firstIndex + actualCount);
					
					return actualCount;
				}
				else {
					this->dequeueOvercommit.fetch_add(desiredCount, std::memory_order_release);
				}
			}
			
			return 0;
		}